

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_12f2cc::BuildEngineImpl::RuleInfo::setCancelled(RuleInfo *this)

{
  RuleInfo *this_local;
  
  this->state = Incomplete;
  return;
}

Assistant:

void setCancelled() {
      // If we have to cancel a task, it becomes incomplete. We do not need to
      // sync this to the database, the database won't see an updated record and
      // can continue to maintain the previous view of state -- however, we must
      // mark the internal representation as incomplete because the result is no
      // longer valid.
      state = StateKind::Incomplete;
    }